

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall
SimpleLogger::SimpleLogger
          (SimpleLogger *this,string *file_path,size_t max_log_elems,uint64_t log_file_size_limit,
          uint32_t max_log_files)

{
  int iVar1;
  int *__n;
  undefined8 in_RCX;
  long in_RDI;
  size_t *in_stack_00000060;
  size_t *in_stack_00000068;
  SimpleLogger *in_stack_00000070;
  __integral_type in_stack_ffffffffffffff18;
  atomic<unsigned_long> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff40;
  allocator local_81;
  string local_80 [24];
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  allocator local_49;
  string local_48 [40];
  undefined8 local_20;
  
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"//",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"/",&local_81);
  replaceString(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::atomic<unsigned_long>::atomic(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::ofstream::ofstream((void *)(in_RDI + 0x38));
  *(undefined8 *)(in_RDI + 0x238) = local_20;
  std::atomic<unsigned_int>::atomic
            ((atomic<unsigned_int> *)in_stack_ffffffffffffff20,
             (__integral_type_conflict)(in_stack_ffffffffffffff18 >> 0x20));
  uVar2 = 4;
  std::atomic<int>::atomic
            ((atomic<int> *)in_stack_ffffffffffffff20,
             (__integral_type_conflict1)(in_stack_ffffffffffffff18 >> 0x20));
  std::atomic<int>::atomic
            ((atomic<int> *)in_stack_ffffffffffffff20,
             (__integral_type_conflict1)(in_stack_ffffffffffffff18 >> 0x20));
  std::mutex::mutex((mutex *)0x1170cc);
  __n = (int *)(in_RDI + 0x278);
  iVar1 = SimpleLoggerMgr::getTzGap();
  *__n = iVar1;
  std::atomic<unsigned_long>::atomic(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::allocator<SimpleLogger::LogElem>::allocator((allocator<SimpleLogger::LogElem> *)0x117132);
  std::vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::vector
            ((vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff40),(size_type)__n,
             (allocator_type *)CONCAT44(uVar2,in_stack_ffffffffffffff30));
  std::allocator<SimpleLogger::LogElem>::~allocator((allocator<SimpleLogger::LogElem> *)0x117151);
  std::mutex::mutex((mutex *)0x117162);
  findMinMaxRevNum(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  return;
}

Assistant:

SimpleLogger::SimpleLogger(const std::string& file_path,
                           size_t max_log_elems,
                           uint64_t log_file_size_limit,
                           uint32_t max_log_files)
    : filePath(replaceString(file_path, "//", "/"))
    , maxLogFiles(max_log_files)
    , maxLogFileSize(log_file_size_limit)
    , numCompJobs(0)
    , curLogLevel(4)
    , curDispLevel(4)
    , tzGap( SimpleLoggerMgr::getTzGap() )
    , cursor(0)
    , logs(max_log_elems)
{
    findMinMaxRevNum(minRevnum, curRevnum);
}